

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.cpp
# Opt level: O1

MIPMap * pbrt::ImageTextureBase::GetTexture
                   (string *filename,string *filter,Float maxAniso,WrapMode wrap,
                   ColorEncodingHandle *encoding,Allocator alloc)

{
  undefined8 __p;
  int iVar1;
  iterator iVar2;
  mapped_type *pmVar3;
  __uniq_ptr_impl<pbrt::MIPMap,_std::default_delete<pbrt::MIPMap>_> *this;
  FilterFunction FVar4;
  MIPMap *pMVar5;
  bool bVar6;
  unique_ptr<pbrt::MIPMap,_std::default_delete<pbrt::MIPMap>_> mipmap;
  unique_lock<std::mutex> lock;
  TexInfo texInfo;
  MIPMapFilterOptions local_d0;
  undefined1 local_c8 [16];
  undefined1 local_b8 [32];
  undefined1 local_98;
  TexInfo local_90;
  TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
  local_40;
  TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
  local_38;
  
  local_38.bits =
       (encoding->
       super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
       ).bits;
  TexInfo::TexInfo(&local_90,filename,filter,maxAniso,wrap,(ColorEncodingHandle *)&local_38);
  local_b8._24_8_ = textureCacheMutex;
  local_98 = 0;
  std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)(local_b8 + 0x18));
  local_98 = 1;
  iVar2 = std::
          _Rb_tree<pbrt::TexInfo,_std::pair<const_pbrt::TexInfo,_std::unique_ptr<pbrt::MIPMap,_std::default_delete<pbrt::MIPMap>_>_>,_std::_Select1st<std::pair<const_pbrt::TexInfo,_std::unique_ptr<pbrt::MIPMap,_std::default_delete<pbrt::MIPMap>_>_>_>,_std::less<pbrt::TexInfo>,_std::allocator<std::pair<const_pbrt::TexInfo,_std::unique_ptr<pbrt::MIPMap,_std::default_delete<pbrt::MIPMap>_>_>_>_>
          ::find((_Rb_tree<pbrt::TexInfo,_std::pair<const_pbrt::TexInfo,_std::unique_ptr<pbrt::MIPMap,_std::default_delete<pbrt::MIPMap>_>_>,_std::_Select1st<std::pair<const_pbrt::TexInfo,_std::unique_ptr<pbrt::MIPMap,_std::default_delete<pbrt::MIPMap>_>_>_>,_std::less<pbrt::TexInfo>,_std::allocator<std::pair<const_pbrt::TexInfo,_std::unique_ptr<pbrt::MIPMap,_std::default_delete<pbrt::MIPMap>_>_>_>_>
                  *)textureCache,&local_90);
  if (iVar2._M_node == (_Base_ptr)(textureCache + 8)) {
    local_b8._16_8_ = alloc.memoryResource;
    std::unique_lock<std::mutex>::unlock((unique_lock<std::mutex> *)(local_b8 + 0x18));
    local_d0.filter = EWA;
    local_d0.maxAnisotropy = maxAniso;
    iVar1 = std::__cxx11::string::compare((char *)filter);
    bVar6 = true;
    FVar4 = EWA;
    if ((iVar1 != 0) && (iVar1 = std::__cxx11::string::compare((char *)filter), iVar1 != 0)) {
      iVar1 = std::__cxx11::string::compare((char *)filter);
      if (iVar1 == 0) {
        FVar4 = Trilinear;
      }
      else {
        iVar1 = std::__cxx11::string::compare((char *)filter);
        if (iVar1 == 0) {
          FVar4 = Bilinear;
        }
        else {
          iVar1 = std::__cxx11::string::compare((char *)filter);
          bVar6 = iVar1 == 0;
          FVar4 = Point;
        }
      }
    }
    if (!bVar6) {
      local_c8._8_8_ = (Image *)0x0;
      local_b8[0] = '\0';
      local_c8._0_8_ = (pointer)local_b8;
      detail::stringPrintfRecursive<std::__cxx11::string_const&>
                ((string *)local_c8,"%s: filter function unknown",filter);
      Warning((FileLoc *)0x0,(char *)local_c8._0_8_);
      FVar4 = local_d0.filter;
      if ((pointer)local_c8._0_8_ != (pointer)local_b8) {
        operator_delete((void *)local_c8._0_8_,CONCAT71(local_b8._1_7_,local_b8[0]) + 1);
        FVar4 = local_d0.filter;
      }
    }
    local_d0.filter = FVar4;
    local_40.bits =
         (encoding->
         super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
         ).bits;
    MIPMap::CreateFromFile
              ((MIPMap *)local_c8,filename,&local_d0,wrap,(ColorEncodingHandle *)&local_40,
               (Allocator)local_b8._16_8_);
    if ((pointer)local_c8._0_8_ == (pointer)0x0) {
      pMVar5 = (MIPMap *)0x0;
    }
    else {
      std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)(local_b8 + 0x18));
      iVar2 = std::
              _Rb_tree<pbrt::TexInfo,_std::pair<const_pbrt::TexInfo,_std::unique_ptr<pbrt::MIPMap,_std::default_delete<pbrt::MIPMap>_>_>,_std::_Select1st<std::pair<const_pbrt::TexInfo,_std::unique_ptr<pbrt::MIPMap,_std::default_delete<pbrt::MIPMap>_>_>_>,_std::less<pbrt::TexInfo>,_std::allocator<std::pair<const_pbrt::TexInfo,_std::unique_ptr<pbrt::MIPMap,_std::default_delete<pbrt::MIPMap>_>_>_>_>
              ::find((_Rb_tree<pbrt::TexInfo,_std::pair<const_pbrt::TexInfo,_std::unique_ptr<pbrt::MIPMap,_std::default_delete<pbrt::MIPMap>_>_>,_std::_Select1st<std::pair<const_pbrt::TexInfo,_std::unique_ptr<pbrt::MIPMap,_std::default_delete<pbrt::MIPMap>_>_>_>,_std::less<pbrt::TexInfo>,_std::allocator<std::pair<const_pbrt::TexInfo,_std::unique_ptr<pbrt::MIPMap,_std::default_delete<pbrt::MIPMap>_>_>_>_>
                      *)textureCache,&local_90);
      if (iVar2._M_node != (_Base_ptr)(textureCache + 8)) {
        LogFatal<char_const(&)[49]>
                  (Fatal,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/textures.cpp"
                   ,0x19c,"Check failed: %s",
                   (char (*) [49])"textureCache.find(texInfo) == textureCache.end()");
      }
      this = (__uniq_ptr_impl<pbrt::MIPMap,_std::default_delete<pbrt::MIPMap>_> *)
             std::
             map<pbrt::TexInfo,_std::unique_ptr<pbrt::MIPMap,_std::default_delete<pbrt::MIPMap>_>,_std::less<pbrt::TexInfo>,_std::allocator<std::pair<const_pbrt::TexInfo,_std::unique_ptr<pbrt::MIPMap,_std::default_delete<pbrt::MIPMap>_>_>_>_>
             ::operator[]((map<pbrt::TexInfo,_std::unique_ptr<pbrt::MIPMap,_std::default_delete<pbrt::MIPMap>_>,_std::less<pbrt::TexInfo>,_std::allocator<std::pair<const_pbrt::TexInfo,_std::unique_ptr<pbrt::MIPMap,_std::default_delete<pbrt::MIPMap>_>_>_>_>
                           *)textureCache,&local_90);
      __p = local_c8._0_8_;
      local_c8._0_8_ = (pointer)0x0;
      std::__uniq_ptr_impl<pbrt::MIPMap,_std::default_delete<pbrt::MIPMap>_>::reset
                (this,(pointer)__p);
      pmVar3 = std::
               map<pbrt::TexInfo,_std::unique_ptr<pbrt::MIPMap,_std::default_delete<pbrt::MIPMap>_>,_std::less<pbrt::TexInfo>,_std::allocator<std::pair<const_pbrt::TexInfo,_std::unique_ptr<pbrt::MIPMap,_std::default_delete<pbrt::MIPMap>_>_>_>_>
               ::operator[]((map<pbrt::TexInfo,_std::unique_ptr<pbrt::MIPMap,_std::default_delete<pbrt::MIPMap>_>,_std::less<pbrt::TexInfo>,_std::allocator<std::pair<const_pbrt::TexInfo,_std::unique_ptr<pbrt::MIPMap,_std::default_delete<pbrt::MIPMap>_>_>_>_>
                             *)textureCache,&local_90);
      pMVar5 = (pmVar3->_M_t).
               super___uniq_ptr_impl<pbrt::MIPMap,_std::default_delete<pbrt::MIPMap>_>._M_t.
               super__Tuple_impl<0UL,_pbrt::MIPMap_*,_std::default_delete<pbrt::MIPMap>_>.
               super__Head_base<0UL,_pbrt::MIPMap_*,_false>._M_head_impl;
    }
    std::unique_ptr<pbrt::MIPMap,_std::default_delete<pbrt::MIPMap>_>::~unique_ptr
              ((unique_ptr<pbrt::MIPMap,_std::default_delete<pbrt::MIPMap>_> *)local_c8);
  }
  else {
    pmVar3 = std::
             map<pbrt::TexInfo,_std::unique_ptr<pbrt::MIPMap,_std::default_delete<pbrt::MIPMap>_>,_std::less<pbrt::TexInfo>,_std::allocator<std::pair<const_pbrt::TexInfo,_std::unique_ptr<pbrt::MIPMap,_std::default_delete<pbrt::MIPMap>_>_>_>_>
             ::operator[]((map<pbrt::TexInfo,_std::unique_ptr<pbrt::MIPMap,_std::default_delete<pbrt::MIPMap>_>,_std::less<pbrt::TexInfo>,_std::allocator<std::pair<const_pbrt::TexInfo,_std::unique_ptr<pbrt::MIPMap,_std::default_delete<pbrt::MIPMap>_>_>_>_>
                           *)textureCache,&local_90);
    pMVar5 = (pmVar3->_M_t).super___uniq_ptr_impl<pbrt::MIPMap,_std::default_delete<pbrt::MIPMap>_>.
             _M_t.super__Tuple_impl<0UL,_pbrt::MIPMap_*,_std::default_delete<pbrt::MIPMap>_>.
             super__Head_base<0UL,_pbrt::MIPMap_*,_false>._M_head_impl;
  }
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)(local_b8 + 0x18));
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90.filter._M_dataplus._M_p != &local_90.filter.field_2) {
    operator_delete(local_90.filter._M_dataplus._M_p,
                    local_90.filter.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90.filename._M_dataplus._M_p != &local_90.filename.field_2) {
    operator_delete(local_90.filename._M_dataplus._M_p,
                    local_90.filename.field_2._M_allocated_capacity + 1);
  }
  return pMVar5;
}

Assistant:

MIPMap *ImageTextureBase::GetTexture(const std::string &filename,
                                     const std::string &filter, Float maxAniso,
                                     WrapMode wrap, ColorEncodingHandle encoding,
                                     Allocator alloc) {
    // Return _MIPMap_ from texture cache if present
    TexInfo texInfo(filename, filter, maxAniso, wrap, encoding);
    std::unique_lock<std::mutex> lock(textureCacheMutex);
    if (textureCache.find(texInfo) != textureCache.end())
        return textureCache[texInfo].get();
    else
        lock.unlock();

    // Create _MIPMap_ for _filename_
    MIPMapFilterOptions options;
    options.maxAnisotropy = maxAniso;

    pstd::optional<FilterFunction> ff = ParseFilter(filter);
    if (ff)
        options.filter = *ff;
    else
        Warning("%s: filter function unknown", filter);

    std::unique_ptr<MIPMap> mipmap =
        MIPMap::CreateFromFile(filename, options, wrap, encoding, alloc);
    if (mipmap) {
        lock.lock();
        // This is actually ok, but if it hits, it means we've wastefully
        // loaded this texture. (Note that in that case, should just return
        // the one that's already in there and not replace it.)
        CHECK(textureCache.find(texInfo) == textureCache.end());
        textureCache[texInfo] = std::move(mipmap);

        return textureCache[texInfo].get();
    } else
        return nullptr;
}